

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

IReferenceCounters * __thiscall
Diligent::RefCountedObject<Diligent::IDataBlob>::GetReferenceCounters
          (RefCountedObject<Diligent::IDataBlob> *this)

{
  RefCountersImpl *pRVar1;
  char (*in_RCX) [26];
  string msg;
  string local_30;
  
  pRVar1 = this->m_pRefCounters;
  if (pRVar1 == (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetReferenceCounters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x21b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pRVar1 = this->m_pRefCounters;
  }
  return &pRVar1->super_IReferenceCounters;
}

Assistant:

GetReferenceCounters() const override final
    {
        VERIFY_EXPR(m_pRefCounters != nullptr);
        return m_pRefCounters;
    }